

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmarkdowntextedit.cpp
# Opt level: O2

void __thiscall QMarkdownTextEdit::updateLineNumAreaGeometry(QMarkdownTextEdit *this)

{
  long lVar1;
  int iVar2;
  undefined8 uVar3;
  int extraout_var;
  QRect newGeometry;
  
  uVar3 = QWidget::contentsRect();
  iVar2 = LineNumArea::lineNumAreaWidth(this->_lineNumArea);
  lVar1 = *(long *)&this->_lineNumArea->field_0x20;
  if ((((*(int *)(lVar1 + 0x14) != (int)uVar3) ||
       ((int)uVar3 + iVar2 + -1 != *(int *)(lVar1 + 0x1c))) ||
      (*(int *)(lVar1 + 0x18) != (int)((ulong)uVar3 >> 0x20))) ||
     (*(int *)(lVar1 + 0x20) != extraout_var)) {
    QWidget::setGeometry((QRect *)this->_lineNumArea);
  }
  return;
}

Assistant:

void QMarkdownTextEdit::updateLineNumAreaGeometry()
{
    const auto contentsRect = this->contentsRect();
    const QRect newGeometry = {contentsRect.left(), contentsRect.top(),
                               _lineNumArea->sizeHint().width(), contentsRect.height()};
    auto oldGeometry = _lineNumArea->geometry();
    if (newGeometry != oldGeometry) {
        _lineNumArea->setGeometry(newGeometry);
    }
}